

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm_debug.cpp
# Opt level: O0

void lvm_debug_d_s(char *ptr,string *str,size_t temp)

{
  bool bVar1;
  ostream *poVar2;
  int local_254;
  int o;
  int p;
  int h;
  int i;
  int m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  uint local_200;
  allocator local_1f9;
  uint data_num;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [376];
  string local_40 [8];
  string data_adr;
  size_t temp_local;
  string *str_local;
  char *ptr_local;
  
  if (ptr == data_ptr) {
    printf("DATA:\n");
  }
  else if (ptr == stack_ptr) {
    printf("STACK:SP--->%08X\n",(ulong)registe_ptr->SP);
  }
  std::__cxx11::string::substr((ulong)local_40,(ulong)str);
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&data_num,"",&local_1f9);
  std::__cxx11::stringstream::str((string *)local_1c8);
  std::__cxx11::string::~string((string *)&data_num);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  local_200 = 0;
  std::__cxx11::string::substr((ulong)local_220,(ulong)local_40);
  bVar1 = std::operator==(local_220,"0x");
  std::__cxx11::string::~string((string *)local_220);
  if (bVar1) {
    poVar2 = (ostream *)std::ostream::operator<<(local_1b8,std::hex);
    std::__cxx11::string::substr((ulong)&i,(ulong)local_40);
    std::operator<<(poVar2,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::istream::operator>>((istream *)local_1c8,&local_200);
  }
  else {
    std::operator<<(local_1b8,local_40);
    std::istream::operator>>((istream *)local_1c8,&local_200);
  }
  h = 0;
  for (p = 0; p < 3; p = p + 1) {
    printf("%08X\t",(ulong)(local_200 + h));
    for (o = 0; o < 0x10; o = o + 1) {
      printf("%02X ",(long)ptr[local_200 + h]);
      h = h + 1;
    }
    local_254 = h + -0x10;
    putchar(0x7c);
    for (; local_254 < h; local_254 = local_254 + 1) {
      if ((ptr[local_200 + local_254] == '\n') || (ptr[local_200 + local_254] == '\r')) {
        putchar(0x2a);
      }
      else {
        putchar((int)ptr[local_200 + local_254]);
      }
    }
    printf("\n");
  }
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void lvm_debug_d_s(char * ptr,std::string str,size_t temp) {
	if (ptr == data_ptr)
		printf("DATA:\n");
	else if (ptr == stack_ptr)
		printf("STACK:SP--->%08X\n", registe_ptr->SP);
	std::string data_adr = str.substr(temp + 1);
	std::stringstream ss;
	ss.str("");
	unsigned data_num{ 0 };
	if (data_adr.substr(0, 2) == "0x")//16进制字符串
	{
		ss << std::hex << data_adr.substr(2);
		ss >> data_num;
	}
	else
	{
		ss << data_adr;
		ss >> data_num;
	}
	int m{ 0 };
	for (int i = 0; i < 3; i++)
	{
		printf("%08X	", data_num + m);
		for (int h = 0; h< 16; h++)
		{
			printf("%02X ", (unsigned char *)ptr[data_num + m]);
			++m;
		}
		int p = m - 16;
		putchar('|');
		for (int o = p; o< m; o++)
		{
			if (ptr[data_num + o] == '\x0a' || ptr[data_num + o] == '\x0d') putchar('*');
			else putchar(ptr[data_num + o]);
		}
		printf("\n");
	}
}